

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRect __thiscall QDockAreaLayoutInfo::tabContentRect(QDockAreaLayoutInfo *this)

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  ulong uVar4;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QSize tbh;
  QRect result;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined8 local_18;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[5].x2.m_i & 1) == 0) {
    QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else {
    local_18._0_4_ = in_RDI[2].x2;
    local_18._4_4_ = in_RDI[2].y2;
    local_10.wd.m_i = in_RDI[3].x1.m_i;
    local_10.ht.m_i = in_RDI[3].y1.m_i;
    tabBarSizeHint((QDockAreaLayoutInfo *)
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    bVar3 = QSize::isNull((QSize *)in_RDI);
    if (!bVar3) {
      uVar4 = (ulong)(uint)in_RDI[6].x2.m_i;
      switch(uVar4) {
      case 0:
      case 4:
        QSize::height((QSize *)0x56f6d8);
        QRect::adjust(in_RDI,(int)(uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffffc4,
                      in_stack_ffffffffffffffc0);
        break;
      case 1:
      case 5:
        QSize::height((QSize *)0x56f6f9);
        QRect::adjust(in_RDI,(int)(uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffffc4,
                      in_stack_ffffffffffffffc0);
        break;
      case 2:
      case 6:
        QSize::width((QSize *)0x56f73e);
        QRect::adjust(in_RDI,(int)(uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffffc4,
                      in_stack_ffffffffffffffc0);
        break;
      case 3:
      case 7:
        QSize::width((QSize *)0x56f71b);
        QRect::adjust(in_RDI,(int)(uVar4 >> 0x20),(int)uVar4,in_stack_ffffffffffffffc4,
                      in_stack_ffffffffffffffc0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = local_10.wd.m_i.m_i;
  QVar2.x1.m_i = (undefined4)local_18;
  QVar2.y1.m_i = local_18._4_4_;
  QVar2.y2.m_i = (int)local_10.ht.m_i;
  return QVar2;
}

Assistant:

QRect QDockAreaLayoutInfo::tabContentRect() const
{
    if (!tabbed)
        return QRect();

    QRect result = rect;
    QSize tbh = tabBarSizeHint();

    if (!tbh.isNull()) {
        switch (tabBarShape) {
            case QTabBar::RoundedNorth:
            case QTabBar::TriangularNorth:
                result.adjust(0, tbh.height(), 0, 0);
                break;
            case QTabBar::RoundedSouth:
            case QTabBar::TriangularSouth:
                result.adjust(0, 0, 0, -tbh.height());
                break;
            case QTabBar::RoundedEast:
            case QTabBar::TriangularEast:
                result.adjust(0, 0, -tbh.width(), 0);
                break;
            case QTabBar::RoundedWest:
            case QTabBar::TriangularWest:
                result.adjust(tbh.width(), 0, 0, 0);
                break;
            default:
                break;
        }
    }

    return result;
}